

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_mdtm_resp(connectdata *conn,int ftpcode)

{
  undefined1 *puVar1;
  curl_TimeCond cVar2;
  Curl_easy *data;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  long intime;
  bool bVar6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  time_t tVar10;
  char *fmt;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  time_t secs;
  uint local_e8;
  uint local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  char timebuf [24];
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  if (ftpcode == 0x226) {
    bVar6 = false;
    Curl_failf(data,"Given file does not exist");
    CVar9 = CURLE_FTP_COULDNT_RETR_FILE;
  }
  else {
    if (ftpcode == 0xd5) {
      iVar7 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day,
                              &hour,&minute,&second);
      if (iVar7 == 6) {
        secs = time((time_t *)0x0);
        curl_msnprintf(timebuf,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)year,
                       (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                       (ulong)(uint)second);
        tVar10 = curl_getdate(timebuf,&secs);
        (data->info).filetime = tVar10;
      }
      uVar8 = (uint)*(undefined8 *)&(data->set).field_0x878;
      if (((((uVar8 >> 0x1c & 1) != 0) && ((uVar8 >> 9 & 1) != 0)) &&
          ((conn->proto).ftpc.file != (char *)0x0)) && (intime = (data->info).filetime, -1 < intime)
         ) {
        CVar9 = Curl_gmtime(intime,(tm *)&secs);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        iVar7 = 6;
        if (local_d8 != 0) {
          iVar7 = local_d8 + -1;
        }
        curl_msnprintf(timebuf,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                       Curl_wkday[iVar7],(ulong)local_e4,Curl_month[local_e0],
                       (ulong)(local_dc + 0x76c),(ulong)local_e8,(ulong)secs >> 0x20,
                       secs & 0xffffffff);
        CVar9 = Curl_client_write(conn,3,timebuf,0);
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
      }
    }
    else {
      Curl_infof(data,"unsupported MDTM reply format\n");
    }
    CVar9 = CURLE_OK;
    bVar6 = true;
  }
  cVar2 = (data->set).timecondition;
  if (cVar2 != CURL_TIMECOND_NONE) {
    uVar4 = (data->info).filetime;
    if (((long)uVar4 < 1) || (uVar5 = (data->set).timevalue, (long)uVar5 < 1)) {
      Curl_infof(data,"Skipping time comparison\n");
    }
    else if (cVar2 == CURL_TIMECOND_IFUNMODSINCE) {
      if (uVar5 < uVar4) {
        fmt = "The requested document is not old enough\n";
LAB_004a8898:
        Curl_infof(data,fmt);
        *(undefined4 *)((long)pvVar3 + 0x20) = 2;
        puVar1 = &(data->info).field_0xe0;
        *puVar1 = *puVar1 | 1;
        (conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
    }
    else if (uVar4 <= uVar5) {
      fmt = "The requested document is not new enough\n";
      goto LAB_004a8898;
    }
  }
  if (bVar6) {
    CVar9 = ftp_state_type(conn);
  }
  return CVar9;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct connectdata *conn,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        time_t secs = time(NULL);

        msnprintf(timebuf, sizeof(timebuf),
                  "%04d%02d%02d %02d:%02d:%02d GMT",
                  year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = curl_getdate(timebuf, &secs);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        msnprintf(headerbuf, sizeof(headerbuf),
                  "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                  Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                  tm->tm_mday,
                  Curl_month[tm->tm_mon],
                  tm->tm_year + 1900,
                  tm->tm_hour,
                  tm->tm_min,
                  tm->tm_sec);
        result = Curl_client_write(conn, CLIENTWRITE_BOTH, headerbuf, 0);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format\n");
    break;
  case 550: /* "No such file or directory" */
    failf(data, "Given file does not exist");
    result = CURLE_FTP_COULDNT_RETR_FILE;
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison\n");
    }
  }

  if(!result)
    result = ftp_state_type(conn);

  return result;
}